

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O0

SMBusSignalState * __thiscall SMBusSignalState::ToFrame(SMBusSignalState *this)

{
  U64 *in_RSI;
  SMBusSignalState *this_local;
  Frame *f;
  
  Frame::Frame((Frame *)this);
  *(char *)&this->bus_signal = (char)(int)in_RSI[4];
  this->sample_begin = *in_RSI;
  this->sample_end = in_RSI[1];
  this->sample_rising_clk = 0;
  this->sample_marker = 0;
  *(byte *)((long)&this->bus_signal + 1) = 0;
  return this;
}

Assistant:

Frame SMBusSignalState::ToFrame() const
{
    Frame f;

    f.mType = bus_signal;
    f.mStartingSampleInclusive = sample_begin;
    f.mEndingSampleInclusive = sample_end;
    f.mData1 = f.mData2 = 0;
    f.mFlags = 0;

    return f;
}